

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O1

void argo::unparser::save
               (json *j,string *file_name,char *space,char *newline,char *indent,int indent_inc)

{
  json_io_exception *this;
  int *piVar1;
  stream_writer w;
  unparser u;
  ofstream os;
  stream_writer sStack_268;
  unparser local_258;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)file_name,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    stream_writer::stream_writer(&sStack_268,(ostream *)&local_230);
    local_258.m_writer = &sStack_268.super_writer;
    local_258.m_space = space;
    local_258.m_newline = newline;
    local_258.m_indent = indent;
    local_258.m_indent_inc = indent_inc;
    unparse(&local_258,j,0);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this = (json_io_exception *)__cxa_allocate_exception(0xd8);
  piVar1 = __errno_location();
  json_io_exception::json_io_exception(this,file_open_failed_e,*piVar1);
  __cxa_throw(this,&json_io_exception::typeinfo,std::exception::~exception);
}

Assistant:

void unparser::save(
        const json   &j,
        const string &file_name,
        const char   *space,
        const char   *newline,
        const char   *indent,
        int          indent_inc)
{
    ofstream os(file_name);

    if (os)
    {
        stream_writer w(&os);
        unparser u(w, space, newline, indent, indent_inc);
        u.unparse(j, 0);
    }
    else
    {
        throw json_io_exception(json_io_exception::file_open_failed_e, errno);
    }
}